

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double insphereexact(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double b;
  double b_00;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double deb [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double temp16 [16];
  double det384x [384];
  double temp192 [192];
  double det384z [384];
  double det384y [384];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double detxy [768];
  double ddet [1152];
  double cdet [1152];
  double bdet [1152];
  double adet [1152];
  double edet [1152];
  double cddet [2304];
  double abdet [2304];
  double deter [5760];
  double cdedet [3456];
  double dStack_2c390;
  double dStack_2c380;
  double dStack_2c370;
  double dStack_2c350;
  double dStack_2c330;
  double dStack_2c300;
  double dStack_2c210;
  undefined1 auStack_2c1f8 [16];
  double dStack_2c1e8;
  double dStack_2c1e0;
  undefined1 auStack_2c1d8 [16];
  double dStack_2c1c8;
  double dStack_2c1c0;
  double dStack_2c1b8;
  double dStack_2c1b0;
  double dStack_2c1a8;
  double dStack_2c1a0;
  undefined1 auStack_2c198 [16];
  double dStack_2c188;
  double dStack_2c180;
  undefined1 auStack_2c178 [16];
  double dStack_2c168;
  double dStack_2c160;
  double dStack_2c158;
  double dStack_2c150;
  double dStack_2c148;
  double dStack_2c140;
  double dStack_2c138;
  double dStack_2c130;
  double dStack_2c128;
  double dStack_2c120;
  undefined1 auStack_2c118 [16];
  double dStack_2c108;
  double dStack_2c100;
  undefined1 auStack_2c0f8 [16];
  double dStack_2c0e8;
  double dStack_2c0e0;
  double dStack_2c0d8;
  double dStack_2c0d0;
  double dStack_2c0c8;
  double dStack_2c0c0;
  double adStack_2c0b8 [48];
  double adStack_2bf38 [48];
  double adStack_2bdb8 [24];
  double adStack_2bcf8 [24];
  double adStack_2bc38 [24];
  double adStack_2bb78 [24];
  double adStack_2bab8 [24];
  double adStack_2b9f8 [24];
  double adStack_2b938 [24];
  double adStack_2b878 [24];
  double adStack_2b7b8 [24];
  double adStack_2b6f8 [24];
  double adStack_2b638 [8];
  double adStack_2b5f8 [8];
  double adStack_2b5b8 [16];
  double adStack_2b538 [384];
  double adStack_2a938 [192];
  double adStack_2a338 [384];
  double adStack_29738 [384];
  double adStack_28b38 [96];
  double adStack_28838 [96];
  double adStack_28538 [96];
  double adStack_28238 [96];
  double adStack_27f38 [96];
  double adStack_27c38 [768];
  double adStack_26438 [1152];
  double adStack_24038 [1152];
  double adStack_21c38 [1152];
  double adStack_1f838 [1152];
  double adStack_1d438 [1152];
  double adStack_1b038 [2304];
  double adStack_16838 [2303];
  double adStack_12040 [5761];
  double local_6c38 [3457];
  
  dVar36 = *pb;
  dVar39 = pb[1];
  b = *pa;
  b_00 = pa[1];
  dVar32 = dVar39 * b;
  dVar49 = dVar36 * b_00;
  dVar8 = splitter * dVar39 - (splitter * dVar39 - dVar39);
  dVar11 = splitter * dVar36 - (splitter * dVar36 - dVar36);
  dVar54 = dVar39 - dVar8;
  dVar56 = dVar36 - dVar11;
  dVar27 = splitter * b - (splitter * b - b);
  dVar30 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar34 = b - dVar27;
  dVar37 = b_00 - dVar30;
  dVar35 = dVar54 * dVar34 - (((dVar32 - dVar27 * dVar8) - dVar34 * dVar8) - dVar54 * dVar27);
  dVar38 = dVar56 * dVar37 - (((dVar49 - dVar11 * dVar30) - dVar56 * dVar30) - dVar37 * dVar11);
  dVar40 = dVar35 - dVar38;
  dVar28 = dVar32 + dVar40;
  dVar32 = (dVar32 - (dVar28 - (dVar28 - dVar32))) + (dVar40 - (dVar28 - dVar32));
  dVar33 = dVar32 - dVar49;
  dVar27 = -dVar27;
  dVar11 = -dVar11;
  dStack_2c1b8 = (dVar35 - (dVar40 + (dVar35 - dVar40))) + ((dVar35 - dVar40) - dVar38);
  dStack_2c1b0 = (dVar32 - (dVar33 + (dVar32 - dVar33))) + ((dVar32 - dVar33) - dVar49);
  dStack_2c1a0 = dVar28 + dVar33;
  dStack_2c1a8 = (dVar28 - (dStack_2c1a0 - (dStack_2c1a0 - dVar28))) +
                 (dVar33 - (dStack_2c1a0 - dVar28));
  dVar42 = *pc;
  dVar29 = pc[1];
  dVar38 = splitter * dVar42 - (splitter * dVar42 - dVar42);
  dVar57 = splitter * dVar29 - (splitter * dVar29 - dVar29);
  auVar1 = *(undefined1 (*) [16])pd;
  dVar33 = auVar1._0_8_;
  dVar35 = auVar1._8_8_;
  auVar3._8_4_ = auVar1._0_4_;
  auVar3._0_8_ = dVar35;
  auVar3._12_4_ = auVar1._4_4_;
  dVar41 = splitter * dVar35 - (splitter * dVar35 - dVar35);
  dVar43 = splitter * dVar33 - (splitter * dVar33 - dVar33);
  dVar9 = -dVar38;
  auVar6._8_4_ = SUB84(dVar43,0);
  auVar6._0_8_ = dVar9;
  auVar6._12_4_ = (uint)((ulong)dVar43 >> 0x20) ^ 0x80000000;
  dVar10 = dVar42 - dVar38;
  dVar31 = dVar29 - dVar57;
  dVar44 = dVar35 - dVar41;
  dVar33 = dVar33 - dVar43;
  dVar32 = -dVar34;
  auVar1._8_4_ = SUB84(dVar56,0);
  auVar1._0_8_ = dVar32;
  auVar1._12_4_ = (int)((ulong)-dVar56 >> 0x20);
  dVar46 = -dVar10;
  dVar48 = -dVar33;
  dVar47 = dVar39 * dVar42;
  dVar49 = dVar36 * dVar29;
  dStack_2c380 = auVar6._8_8_;
  auVar7._8_4_ = SUB84(dVar31,0);
  auVar7._0_8_ = dVar10;
  auVar7._12_4_ = (int)((ulong)dVar31 >> 0x20);
  dVar50 = dVar54 * dVar10 - (dVar9 * dVar54 + dVar46 * dVar8 + dVar9 * dVar8 + dVar47);
  dVar51 = dVar56 * dVar31 - (dVar31 * dVar11 + dVar57 * -dVar56 + dVar57 * dVar11 + dVar49);
  dVar55 = dVar51 - dVar50;
  dVar40 = dVar49 + dVar55;
  dVar49 = (dVar49 - (dVar40 - (dVar40 - dVar49))) + (dVar55 - (dVar40 - dVar49));
  dVar28 = dVar49 - dVar47;
  dStack_2c0d8 = (dVar51 - (dVar55 + (dVar51 - dVar55))) + ((dVar51 - dVar55) - dVar50);
  dStack_2c0d0 = (dVar49 - ((dVar49 - dVar28) + dVar28)) + ((dVar49 - dVar28) - dVar47);
  dStack_2c0c0 = dVar40 + dVar28;
  dStack_2c0c8 = (dVar40 - (dStack_2c0c0 - (dStack_2c0c0 - dVar40))) +
                 (dVar28 - (dStack_2c0c0 - dVar40));
  dStack_2c370 = auVar3._8_8_;
  dVar49 = dVar42 * dVar35;
  dVar47 = dVar29 * dStack_2c370;
  dVar40 = dVar10 * dVar44 - (((dVar49 - dVar38 * dVar41) - dVar41 * dVar10) - dVar44 * dVar38);
  dVar31 = dVar31 * dVar33 - (((dVar47 - dVar43 * dVar57) - dVar57 * dVar33) - dVar31 * dVar43);
  dVar43 = dVar40 - dVar31;
  dVar38 = dVar49 + dVar43;
  dVar49 = (dVar49 - (dVar38 - (dVar38 - dVar49))) + (dVar43 - (dVar38 - dVar49));
  dVar28 = dVar49 - dVar47;
  dVar49 = (dVar49 - (dVar28 + (dVar49 - dVar28))) + ((dVar49 - dVar28) - dVar47);
  auStack_2c0f8._8_4_ = SUB84(dVar49,0);
  auStack_2c0f8._0_8_ = (dVar40 - (dVar43 + (dVar40 - dVar43))) + ((dVar40 - dVar43) - dVar31);
  auStack_2c0f8._12_4_ = (int)((ulong)dVar49 >> 0x20);
  dStack_2c0e0 = dVar38 + dVar28;
  dStack_2c0e8 = (dVar38 - (dStack_2c0e0 - (dStack_2c0e0 - dVar38))) +
                 (dVar28 - (dStack_2c0e0 - dVar38));
  dVar47 = *pe;
  dVar50 = pe[1];
  dVar49 = splitter * dVar47 - (splitter * dVar47 - dVar47);
  dVar28 = splitter * dVar50 - (splitter * dVar50 - dVar50);
  dVar40 = -dVar49;
  dVar52 = dVar47 - dVar49;
  dVar53 = dVar50 - dVar28;
  dVar58 = -dVar52;
  auVar4._8_4_ = SUB84(dVar28,0);
  auVar4._0_8_ = dVar49;
  auVar4._12_4_ = (int)((ulong)dVar28 >> 0x20);
  dVar49 = dVar35 * dVar47;
  dVar38 = dStack_2c370 * dVar50;
  dVar55 = dVar44 * dVar52 - (dVar40 * dVar44 + dVar58 * dVar41 + dVar40 * dVar41 + dVar49);
  dVar45 = dVar33 * dVar53 -
           (dVar53 * dStack_2c380 + dVar28 * dVar48 + dVar28 * dStack_2c380 + dVar38);
  dVar51 = dVar45 - dVar55;
  dVar43 = dVar38 + dVar51;
  dVar38 = (dVar38 - (dVar43 - (dVar43 - dVar38))) + (dVar51 - (dVar43 - dVar38));
  dVar31 = dVar38 - dVar49;
  dVar49 = (dVar38 - ((dVar38 - dVar31) + dVar31)) + ((dVar38 - dVar31) - dVar49);
  auStack_2c118._8_4_ = SUB84(dVar49,0);
  auStack_2c118._0_8_ = (dVar45 - (dVar51 + (dVar45 - dVar51))) + ((dVar45 - dVar51) - dVar55);
  auStack_2c118._12_4_ = (int)((ulong)dVar49 >> 0x20);
  dStack_2c100 = dVar43 + dVar31;
  dStack_2c108 = (dVar43 - (dStack_2c100 - (dStack_2c100 - dVar43))) +
                 (dVar31 - (dStack_2c100 - dVar43));
  dVar31 = b_00 * dVar47;
  dVar55 = b * dVar50;
  dStack_2c210 = auVar7._8_8_;
  auVar2._8_4_ = SUB84(dVar33 * dVar37,0);
  auVar2._0_8_ = dVar44 * dVar34;
  auVar2._12_4_ = (int)((ulong)(dVar33 * dVar37) >> 0x20);
  dVar49 = dVar37 * dVar52 - (dVar37 * dVar40 + dVar58 * dVar30 + dVar40 * dVar30 + dVar31);
  dVar28 = dVar34 * dVar53 - (dVar53 * dVar27 + dVar32 * dVar28 + dVar27 * dVar28 + dVar55);
  dVar38 = dVar49 - dVar28;
  dVar51 = dVar31 + dVar38;
  dVar31 = (dVar31 - (dVar51 - (dVar51 - dVar31))) + (dVar38 - (dVar51 - dVar31));
  dVar43 = dVar31 - dVar55;
  dStack_2c138 = (dVar49 - (dVar38 + (dVar49 - dVar38))) + ((dVar49 - dVar38) - dVar28);
  dStack_2c130 = (dVar31 - (dVar43 + (dVar31 - dVar43))) + ((dVar31 - dVar43) - dVar55);
  dStack_2c120 = dVar51 + dVar43;
  dStack_2c128 = (dVar51 - (dStack_2c120 - (dStack_2c120 - dVar51))) +
                 (dVar43 - (dStack_2c120 - dVar51));
  dVar38 = dVar39 * dVar47;
  auVar5._8_4_ = SUB84(dVar36 * dVar50,0);
  auVar5._0_8_ = dVar38;
  auVar5._12_4_ = (int)((ulong)(dVar36 * dVar50) >> 0x20);
  dVar50 = dVar50 * dVar42;
  dVar47 = dVar47 * dVar29;
  dVar29 = dVar29 * b;
  dVar42 = dVar42 * b_00;
  dVar43 = dStack_2c210 * dVar34 -
           (dStack_2c210 * dVar27 + dVar32 * dVar57 + dVar27 * dVar57 + dVar29);
  dVar51 = dVar10 * dVar37 - (dVar37 * dVar9 + dVar46 * dVar30 + dVar9 * dVar30 + dVar42);
  dVar31 = dVar43 - dVar51;
  dVar49 = dVar29 + dVar31;
  dVar28 = (dVar29 - (dVar49 - (dVar49 - dVar29))) + (dVar31 - (dVar49 - dVar29));
  dVar29 = dVar28 - dVar42;
  dStack_2c158 = (dVar43 - (dVar31 + (dVar43 - dVar31))) + ((dVar43 - dVar31) - dVar51);
  dStack_2c150 = (dVar28 - (dVar29 + (dVar28 - dVar29))) + ((dVar28 - dVar29) - dVar42);
  dStack_2c140 = dVar49 + dVar29;
  dStack_2c148 = (dVar49 - (dStack_2c140 - (dStack_2c140 - dVar49))) +
                 (dVar29 - (dStack_2c140 - dVar49));
  dStack_2c300 = auVar1._8_8_;
  dVar36 = dVar36 * dVar35;
  dVar39 = dVar39 * dStack_2c370;
  dVar42 = dVar56 * dVar44 - (dVar44 * dVar11 + dStack_2c300 * dVar41 + dVar11 * dVar41 + dVar36);
  dVar31 = dVar54 * dVar33 -
           (dVar54 * dStack_2c380 + dVar48 * dVar8 + dStack_2c380 * dVar8 + dVar39);
  dVar28 = dVar42 - dVar31;
  dVar49 = dVar36 + dVar28;
  dVar33 = (dVar36 - (dVar49 - (dVar49 - dVar36))) + (dVar28 - (dVar49 - dVar36));
  dVar29 = dVar33 - dVar39;
  dVar33 = (dVar33 - (dVar29 + (dVar33 - dVar29))) + ((dVar33 - dVar29) - dVar39);
  auStack_2c1d8._8_4_ = SUB84(dVar33,0);
  auStack_2c1d8._0_8_ = (dVar42 - (dVar28 + (dVar42 - dVar28))) + ((dVar42 - dVar28) - dVar31);
  auStack_2c1d8._12_4_ = (int)((ulong)dVar33 >> 0x20);
  dStack_2c1c0 = dVar49 + dVar29;
  dStack_2c1c8 = (dVar49 - (dStack_2c1c0 - (dStack_2c1c0 - dVar49))) +
                 (dVar29 - (dStack_2c1c0 - dVar49));
  dStack_2c330 = auVar4._8_8_;
  dVar42 = dVar53 * dVar10 -
           (dVar53 * dVar9 + dVar46 * dStack_2c330 + dVar9 * dStack_2c330 + dVar50);
  dVar57 = dVar52 * dStack_2c210 -
           (dStack_2c210 * dVar40 + dVar58 * dVar57 + dVar40 * dVar57 + dVar47);
  dVar28 = dVar42 - dVar57;
  dVar49 = dVar50 + dVar28;
  dVar33 = (dVar50 - (dVar49 - (dVar49 - dVar50))) + (dVar28 - (dVar49 - dVar50));
  dVar29 = dVar33 - dVar47;
  dVar33 = (dVar33 - (dVar29 + (dVar33 - dVar29))) + ((dVar33 - dVar29) - dVar47);
  auStack_2c1f8._8_4_ = SUB84(dVar33,0);
  auStack_2c1f8._0_8_ = (dVar42 - (dVar28 + (dVar42 - dVar28))) + ((dVar42 - dVar28) - dVar57);
  auStack_2c1f8._12_4_ = (int)((ulong)dVar33 >> 0x20);
  dStack_2c1e0 = dVar49 + dVar29;
  dStack_2c1e8 = (dVar49 - (dStack_2c1e0 - (dStack_2c1e0 - dVar49))) +
                 (dVar29 - (dStack_2c1e0 - dVar49));
  dVar35 = dVar35 * b;
  dStack_2c370 = dStack_2c370 * b_00;
  dStack_2c390 = auVar2._8_8_;
  dVar32 = dVar44 * dVar34 - (dVar44 * dVar27 + dVar32 * dVar41 + dVar27 * dVar41 + dVar35);
  dStack_2c390 = dStack_2c390 -
                 (dVar37 * dStack_2c380 + dVar48 * dVar30 + dStack_2c380 * dVar30 + dStack_2c370);
  dVar27 = dStack_2c390 - dVar32;
  dVar33 = dStack_2c370 + dVar27;
  dVar49 = (dStack_2c370 - (dVar33 - (dVar33 - dStack_2c370))) + (dVar27 - (dVar33 - dStack_2c370));
  dVar28 = dVar49 - dVar35;
  dVar49 = (dVar49 - ((dVar49 - dVar28) + dVar28)) + ((dVar49 - dVar28) - dVar35);
  auStack_2c178._8_4_ = SUB84(dVar49,0);
  auStack_2c178._0_8_ =
       (dStack_2c390 - (dVar27 + (dStack_2c390 - dVar27))) + ((dStack_2c390 - dVar27) - dVar32);
  auStack_2c178._12_4_ = (int)((ulong)dVar49 >> 0x20);
  dStack_2c160 = dVar33 + dVar28;
  dStack_2c168 = (dVar33 - (dStack_2c160 - (dStack_2c160 - dVar33))) +
                 (dVar28 - (dStack_2c160 - dVar33));
  dStack_2c350 = auVar5._8_8_;
  dVar35 = dVar52 * dVar54 - (dVar54 * dVar40 + dVar58 * dVar8 + dVar40 * dVar8 + dVar38);
  dVar27 = dVar53 * dVar56 -
           (dVar53 * dVar11 + dStack_2c300 * dStack_2c330 + dVar11 * dStack_2c330 + dStack_2c350);
  dVar33 = dVar35 - dVar27;
  dVar32 = dVar38 + dVar33;
  dVar49 = (dVar38 - (dVar32 - (dVar32 - dVar38))) + (dVar33 - (dVar32 - dVar38));
  dVar28 = dVar49 - dStack_2c350;
  dVar49 = (dVar49 - (dVar28 + (dVar49 - dVar28))) + ((dVar49 - dVar28) - dStack_2c350);
  auStack_2c198._8_4_ = SUB84(dVar49,0);
  auStack_2c198._0_8_ = (dVar35 - (dVar33 + (dVar35 - dVar33))) + ((dVar35 - dVar33) - dVar27);
  auStack_2c198._12_4_ = (int)((ulong)dVar49 >> 0x20);
  dStack_2c180 = dVar32 + dVar28;
  dStack_2c188 = (dVar32 - (dStack_2c180 - (dStack_2c180 - dVar32))) +
                 (dVar28 - (dStack_2c180 - dVar32));
  dVar32 = pa[2];
  iVar12 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar32,adStack_2b5f8);
  dVar49 = pb[2];
  iVar13 = scale_expansion_zeroelim(4,&dStack_2c158,-dVar49,adStack_2b638);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,adStack_2b5f8,iVar13,adStack_2b638,adStack_2b5b8);
  dVar28 = pc[2];
  iVar13 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar28,adStack_2b5f8);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,adStack_2b5f8,iVar12,adStack_2b5b8,adStack_2b6f8);
  iVar13 = scale_expansion_zeroelim(4,(double *)auStack_2c0f8,dVar49,adStack_2b5f8);
  iVar14 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,-dVar28,adStack_2b638);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_2b5f8,iVar14,adStack_2b638,adStack_2b5b8);
  dVar33 = pd[2];
  iVar14 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar33,adStack_2b5f8);
  iVar13 = fast_expansion_sum_zeroelim(iVar14,adStack_2b5f8,iVar13,adStack_2b5b8,adStack_2b7b8);
  iVar14 = scale_expansion_zeroelim(4,(double *)auStack_2c118,dVar28,adStack_2b5f8);
  iVar15 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,-dVar33,adStack_2b638);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,adStack_2b5f8,iVar15,adStack_2b638,adStack_2b5b8);
  dVar35 = pe[2];
  iVar15 = scale_expansion_zeroelim(4,(double *)auStack_2c0f8,dVar35,adStack_2b5f8);
  iVar14 = fast_expansion_sum_zeroelim(iVar15,adStack_2b5f8,iVar14,adStack_2b5b8,adStack_2b878);
  iVar15 = scale_expansion_zeroelim(4,&dStack_2c138,dVar33,adStack_2b5f8);
  iVar16 = scale_expansion_zeroelim(4,(double *)auStack_2c178,-dVar35,adStack_2b638);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,adStack_2b5f8,iVar16,adStack_2b638,adStack_2b5b8);
  iVar16 = scale_expansion_zeroelim(4,(double *)auStack_2c118,dVar32,adStack_2b5f8);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,adStack_2b5f8,iVar15,adStack_2b5b8,adStack_2b938);
  iVar16 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar35,adStack_2b5f8);
  iVar17 = scale_expansion_zeroelim(4,(double *)auStack_2c198,-dVar32,adStack_2b638);
  iVar16 = fast_expansion_sum_zeroelim(iVar16,adStack_2b5f8,iVar17,adStack_2b638,adStack_2b5b8);
  iVar17 = scale_expansion_zeroelim(4,&dStack_2c138,dVar49,adStack_2b5f8);
  iVar16 = fast_expansion_sum_zeroelim(iVar17,adStack_2b5f8,iVar16,adStack_2b5b8,adStack_2b9f8);
  iVar17 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,dVar32,adStack_2b5f8);
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_2c178,dVar49,adStack_2b638);
  iVar17 = fast_expansion_sum_zeroelim(iVar17,adStack_2b5f8,iVar18,adStack_2b638,adStack_2b5b8);
  iVar18 = scale_expansion_zeroelim(4,&dStack_2c1b8,dVar33,adStack_2b5f8);
  iVar17 = fast_expansion_sum_zeroelim(iVar18,adStack_2b5f8,iVar17,adStack_2b5b8,adStack_2bab8);
  iVar18 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,dVar49,adStack_2b5f8);
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_2c198,dVar28,adStack_2b638);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,adStack_2b5f8,iVar19,adStack_2b638,adStack_2b5b8);
  iVar19 = scale_expansion_zeroelim(4,&dStack_2c0d8,dVar35,adStack_2b5f8);
  iVar18 = fast_expansion_sum_zeroelim(iVar19,adStack_2b5f8,iVar18,adStack_2b5b8,adStack_2bb78);
  iVar19 = scale_expansion_zeroelim(4,(double *)auStack_2c178,dVar28,adStack_2b5f8);
  iVar20 = scale_expansion_zeroelim(4,&dStack_2c158,dVar33,adStack_2b638);
  iVar19 = fast_expansion_sum_zeroelim(iVar19,adStack_2b5f8,iVar20,adStack_2b638,adStack_2b5b8);
  iVar20 = scale_expansion_zeroelim(4,(double *)auStack_2c0f8,dVar32,adStack_2b5f8);
  iVar19 = fast_expansion_sum_zeroelim(iVar20,adStack_2b5f8,iVar19,adStack_2b5b8,adStack_2bc38);
  iVar20 = scale_expansion_zeroelim(4,(double *)auStack_2c198,dVar33,adStack_2b5f8);
  iVar21 = scale_expansion_zeroelim(4,(double *)auStack_2c1d8,dVar35,adStack_2b638);
  iVar20 = fast_expansion_sum_zeroelim(iVar20,adStack_2b5f8,iVar21,adStack_2b638,adStack_2b5b8);
  iVar21 = scale_expansion_zeroelim(4,(double *)auStack_2c118,dVar49,adStack_2b5f8);
  iVar20 = fast_expansion_sum_zeroelim(iVar21,adStack_2b5f8,iVar20,adStack_2b5b8,adStack_2bcf8);
  iVar21 = scale_expansion_zeroelim(4,&dStack_2c158,dVar35,adStack_2b5f8);
  iVar22 = scale_expansion_zeroelim(4,(double *)auStack_2c1f8,dVar32,adStack_2b638);
  iVar21 = fast_expansion_sum_zeroelim(iVar21,adStack_2b5f8,iVar22,adStack_2b638,adStack_2b5b8);
  iVar22 = scale_expansion_zeroelim(4,&dStack_2c138,dVar28,adStack_2b5f8);
  iVar21 = fast_expansion_sum_zeroelim(iVar22,adStack_2b5f8,iVar21,adStack_2b5b8,adStack_2bdb8);
  iVar22 = fast_expansion_sum_zeroelim(iVar14,adStack_2b878,iVar18,adStack_2bb78,adStack_2bf38);
  uVar23 = fast_expansion_sum_zeroelim(iVar20,adStack_2bcf8,iVar13,adStack_2b7b8,adStack_2c0b8);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      adStack_2c0b8[uVar26] = -adStack_2c0b8[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
  iVar22 = fast_expansion_sum_zeroelim(iVar22,adStack_2bf38,uVar23,adStack_2c0b8,adStack_28238);
  iVar24 = scale_expansion_zeroelim(iVar22,adStack_28238,b,adStack_2a938);
  iVar24 = scale_expansion_zeroelim(iVar24,adStack_2a938,b,adStack_2b538);
  iVar25 = scale_expansion_zeroelim(iVar22,adStack_28238,b_00,adStack_2a938);
  iVar25 = scale_expansion_zeroelim(iVar25,adStack_2a938,b_00,adStack_29738);
  iVar22 = scale_expansion_zeroelim(iVar22,adStack_28238,dVar32,adStack_2a938);
  iVar22 = scale_expansion_zeroelim(iVar22,adStack_2a938,dVar32,adStack_2a338);
  iVar24 = fast_expansion_sum_zeroelim(iVar24,adStack_2b538,iVar25,adStack_29738,adStack_27c38);
  iVar22 = fast_expansion_sum_zeroelim(iVar24,adStack_27c38,iVar22,adStack_2a338,adStack_1f838);
  iVar24 = fast_expansion_sum_zeroelim(iVar15,adStack_2b938,iVar19,adStack_2bc38,adStack_2bf38);
  uVar23 = fast_expansion_sum_zeroelim(iVar21,adStack_2bdb8,iVar14,adStack_2b878,adStack_2c0b8);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      adStack_2c0b8[uVar26] = -adStack_2c0b8[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
  iVar14 = fast_expansion_sum_zeroelim(iVar24,adStack_2bf38,uVar23,adStack_2c0b8,adStack_28538);
  dVar32 = *pb;
  iVar24 = scale_expansion_zeroelim(iVar14,adStack_28538,dVar32,adStack_2a938);
  iVar24 = scale_expansion_zeroelim(iVar24,adStack_2a938,dVar32,adStack_2b538);
  dVar32 = pb[1];
  iVar25 = scale_expansion_zeroelim(iVar14,adStack_28538,dVar32,adStack_2a938);
  iVar25 = scale_expansion_zeroelim(iVar25,adStack_2a938,dVar32,adStack_29738);
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_28538,dVar49,adStack_2a938);
  iVar14 = scale_expansion_zeroelim(iVar14,adStack_2a938,dVar49,adStack_2a338);
  iVar24 = fast_expansion_sum_zeroelim(iVar24,adStack_2b538,iVar25,adStack_29738,adStack_27c38);
  iVar14 = fast_expansion_sum_zeroelim(iVar24,adStack_27c38,iVar14,adStack_2a338,adStack_21c38);
  iVar20 = fast_expansion_sum_zeroelim(iVar16,adStack_2b9f8,iVar20,adStack_2bcf8,adStack_2bf38);
  uVar23 = fast_expansion_sum_zeroelim(iVar17,adStack_2bab8,iVar15,adStack_2b938,adStack_2c0b8);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      adStack_2c0b8[uVar26] = -adStack_2c0b8[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
  iVar15 = fast_expansion_sum_zeroelim(iVar20,adStack_2bf38,uVar23,adStack_2c0b8,adStack_28838);
  dVar32 = *pc;
  iVar20 = scale_expansion_zeroelim(iVar15,adStack_28838,dVar32,adStack_2a938);
  iVar20 = scale_expansion_zeroelim(iVar20,adStack_2a938,dVar32,adStack_2b538);
  dVar32 = pc[1];
  iVar24 = scale_expansion_zeroelim(iVar15,adStack_28838,dVar32,adStack_2a938);
  iVar24 = scale_expansion_zeroelim(iVar24,adStack_2a938,dVar32,adStack_29738);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_28838,dVar28,adStack_2a938);
  iVar15 = scale_expansion_zeroelim(iVar15,adStack_2a938,dVar28,adStack_2a338);
  iVar20 = fast_expansion_sum_zeroelim(iVar20,adStack_2b538,iVar24,adStack_29738,adStack_27c38);
  iVar15 = fast_expansion_sum_zeroelim(iVar20,adStack_27c38,iVar15,adStack_2a338,adStack_24038);
  iVar20 = fast_expansion_sum_zeroelim(iVar12,adStack_2b6f8,iVar21,adStack_2bdb8,adStack_2bf38);
  uVar23 = fast_expansion_sum_zeroelim(iVar18,adStack_2bb78,iVar16,adStack_2b9f8,adStack_2c0b8);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      adStack_2c0b8[uVar26] = -adStack_2c0b8[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
  iVar16 = fast_expansion_sum_zeroelim(iVar20,adStack_2bf38,uVar23,adStack_2c0b8,adStack_28b38);
  dVar32 = *pd;
  iVar18 = scale_expansion_zeroelim(iVar16,adStack_28b38,dVar32,adStack_2a938);
  iVar18 = scale_expansion_zeroelim(iVar18,adStack_2a938,dVar32,adStack_2b538);
  dVar32 = pd[1];
  iVar20 = scale_expansion_zeroelim(iVar16,adStack_28b38,dVar32,adStack_2a938);
  iVar20 = scale_expansion_zeroelim(iVar20,adStack_2a938,dVar32,adStack_29738);
  iVar16 = scale_expansion_zeroelim(iVar16,adStack_28b38,dVar33,adStack_2a938);
  iVar16 = scale_expansion_zeroelim(iVar16,adStack_2a938,dVar33,adStack_2a338);
  iVar18 = fast_expansion_sum_zeroelim(iVar18,adStack_2b538,iVar20,adStack_29738,adStack_27c38);
  iVar16 = fast_expansion_sum_zeroelim(iVar18,adStack_27c38,iVar16,adStack_2a338,adStack_26438);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_2b7b8,iVar17,adStack_2bab8,adStack_2bf38);
  uVar23 = fast_expansion_sum_zeroelim(iVar19,adStack_2bc38,iVar12,adStack_2b6f8,adStack_2c0b8);
  if (0 < (int)uVar23) {
    uVar26 = 0;
    do {
      adStack_2c0b8[uVar26] = -adStack_2c0b8[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar23 != uVar26);
  }
  iVar12 = fast_expansion_sum_zeroelim(iVar13,adStack_2bf38,uVar23,adStack_2c0b8,adStack_27f38);
  dVar32 = *pe;
  iVar13 = scale_expansion_zeroelim(iVar12,adStack_27f38,dVar32,adStack_2a938);
  iVar13 = scale_expansion_zeroelim(iVar13,adStack_2a938,dVar32,adStack_2b538);
  dVar32 = pe[1];
  iVar17 = scale_expansion_zeroelim(iVar12,adStack_27f38,dVar32,adStack_2a938);
  iVar17 = scale_expansion_zeroelim(iVar17,adStack_2a938,dVar32,adStack_29738);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_27f38,dVar35,adStack_2a938);
  iVar12 = scale_expansion_zeroelim(iVar12,adStack_2a938,dVar35,adStack_2a338);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,adStack_2b538,iVar17,adStack_29738,adStack_27c38);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,adStack_27c38,iVar12,adStack_2a338,adStack_1d438);
  iVar13 = fast_expansion_sum_zeroelim(iVar22,adStack_1f838,iVar14,adStack_21c38,adStack_16838);
  iVar14 = fast_expansion_sum_zeroelim(iVar15,adStack_24038,iVar16,adStack_26438,adStack_1b038);
  iVar12 = fast_expansion_sum_zeroelim(iVar14,adStack_1b038,iVar12,adStack_1d438,local_6c38);
  iVar12 = fast_expansion_sum_zeroelim(iVar13,adStack_16838,iVar12,local_6c38,adStack_12040 + 1);
  return adStack_12040[iVar12];
}

Assistant:

REAL insphereexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL temp192[192];
  REAL det384x[384], det384y[384], det384z[384];
  int xlen, ylen, zlen;
  REAL detxy[768];
  int xylen;
  REAL adet[1152], bdet[1152], cdet[1152], ddet[1152], edet[1152];
  int alen, blen, clen, dlen, elen;
  REAL abdet[2304], cddet[2304], cdedet[3456];
  int ablen, cdlen;
  REAL deter[5760];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  xlen = scale_expansion_zeroelim(bcdelen, bcde, pa[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pa[0], det384x);
  ylen = scale_expansion_zeroelim(bcdelen, bcde, pa[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pa[1], det384y);
  zlen = scale_expansion_zeroelim(bcdelen, bcde, pa[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pa[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  alen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  xlen = scale_expansion_zeroelim(cdealen, cdea, pb[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pb[0], det384x);
  ylen = scale_expansion_zeroelim(cdealen, cdea, pb[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pb[1], det384y);
  zlen = scale_expansion_zeroelim(cdealen, cdea, pb[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pb[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  blen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  xlen = scale_expansion_zeroelim(deablen, deab, pc[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pc[0], det384x);
  ylen = scale_expansion_zeroelim(deablen, deab, pc[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pc[1], det384y);
  zlen = scale_expansion_zeroelim(deablen, deab, pc[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pc[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  clen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  xlen = scale_expansion_zeroelim(eabclen, eabc, pd[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pd[0], det384x);
  ylen = scale_expansion_zeroelim(eabclen, eabc, pd[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pd[1], det384y);
  zlen = scale_expansion_zeroelim(eabclen, eabc, pd[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pd[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  dlen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  xlen = scale_expansion_zeroelim(abcdlen, abcd, pe[0], temp192);
  xlen = scale_expansion_zeroelim(xlen, temp192, pe[0], det384x);
  ylen = scale_expansion_zeroelim(abcdlen, abcd, pe[1], temp192);
  ylen = scale_expansion_zeroelim(ylen, temp192, pe[1], det384y);
  zlen = scale_expansion_zeroelim(abcdlen, abcd, pe[2], temp192);
  zlen = scale_expansion_zeroelim(zlen, temp192, pe[2], det384z);
  xylen = fast_expansion_sum_zeroelim(xlen, det384x, ylen, det384y, detxy);
  elen = fast_expansion_sum_zeroelim(xylen, detxy, zlen, det384z, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}